

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.h
# Opt level: O3

size_t GetDataSize<PolicyQualifierInfo>
                 (vector<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_> *in)

{
  pointer pPVar1;
  long lVar2;
  size_t sVar3;
  size_t *psVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  pPVar1 = (in->super__Vector_base<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(in->super__Vector_base<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1;
  if (lVar2 != 0) {
    uVar5 = (lVar2 >> 3) * 0x4ec4ec4ec4ec4ec5;
    psVar4 = &(pPVar1->super_DerBase).cbData;
    uVar6 = 1;
    sVar3 = 0;
    do {
      uVar7 = *psVar4;
      lVar2 = 2;
      if ((((0x7f < uVar7) && (lVar2 = 3, 0xff < uVar7)) && (lVar2 = 4, 0xffff < uVar7)) &&
         (((lVar2 = 5, 0xffffff < uVar7 && (lVar2 = 6, uVar7 >> 0x20 != 0)) &&
          (lVar2 = 7, uVar7 >> 0x28 != 0)))) {
        lVar2 = (ulong)(uVar7 >> 0x30 == 0) << 3;
      }
      sVar3 = sVar3 + uVar7 + lVar2;
      uVar7 = (ulong)uVar6;
      psVar4 = psVar4 + 0xd;
      uVar6 = uVar6 + 1;
    } while (uVar7 <= uVar5 && uVar5 - uVar7 != 0);
    return sVar3;
  }
  return 0;
}

Assistant:

size_t GetDataSize(std::vector<T>& in) 
{
	size_t ret = 0;
	for (unsigned int i = 0; i < in.size(); ++i)
	{
		ret += in[i].EncodedSize();
	}

	return ret;
}